

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O0

_Bool trans_fsgnjn_s(DisasContext_conflict12 *ctx,arg_fsgnjn_s *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 ret;
  TCGv_i64 t0;
  TCGContext_conflict11 *tcg_ctx;
  arg_fsgnjn_s *a_local;
  DisasContext_conflict12 *ctx_local;
  
  if (ctx->mstatus_fs == 0) {
    ctx_local._7_1_ = false;
  }
  else {
    _Var1 = has_ext(ctx,0x20);
    if (_Var1) {
      tcg_ctx_00 = ctx->uc->tcg_ctx;
      if (a->rs1 == a->rs2) {
        tcg_gen_xori_i64_riscv64
                  (tcg_ctx_00,tcg_ctx_00->cpu_fpr[a->rd],tcg_ctx_00->cpu_fpr[a->rs1],-0x80000000);
      }
      else {
        ret = tcg_temp_new_i64(tcg_ctx_00);
        tcg_gen_not_i64_riscv64(tcg_ctx_00,ret,tcg_ctx_00->cpu_fpr[a->rs2]);
        tcg_gen_deposit_i64_riscv64
                  (tcg_ctx_00,tcg_ctx_00->cpu_fpr[a->rd],ret,tcg_ctx_00->cpu_fpr[a->rs1],0,0x1f);
        tcg_temp_free_i64(tcg_ctx_00,ret);
      }
      mark_fs_dirty(ctx);
      ctx_local._7_1_ = true;
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  return ctx_local._7_1_;
}

Assistant:

static bool trans_fsgnjn_s(DisasContext *ctx, arg_fsgnjn_s *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (a->rs1 == a->rs2) { /* FNEG */
        tcg_gen_xori_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rs1], INT32_MIN);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_not_i64(tcg_ctx, t0, tcg_ctx->cpu_fpr[a->rs2]);
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], t0, tcg_ctx->cpu_fpr[a->rs1], 0, 31);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
    mark_fs_dirty(ctx);
    return true;
}